

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeKernelGetName(ze_kernel_handle_t hKernel,size_t *pSize,char *pName)

{
  ze_pfnKernelGetName_t pfnGetName;
  dditable_t *dditable;
  ze_result_t result;
  char *pName_local;
  size_t *pSize_local;
  ze_kernel_handle_t hKernel_local;
  
  if (*(code **)(*(long *)(hKernel + 8) + 0x5a8) == (code *)0x0) {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hKernel_local._4_4_ =
         (**(code **)(*(long *)(hKernel + 8) + 0x5a8))(*(undefined8 *)hKernel,pSize,pName);
  }
  return hKernel_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetName(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        size_t* pSize,                                  ///< [in,out] size of kernel name string, including null terminator, in
                                                        ///< bytes.
        char* pName                                     ///< [in,out][optional] char pointer to kernel name.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_kernel_object_t*>( hKernel )->dditable;
        auto pfnGetName = dditable->ze.Kernel.pfnGetName;
        if( nullptr == pfnGetName )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hKernel = reinterpret_cast<ze_kernel_object_t*>( hKernel )->handle;

        // forward to device-driver
        result = pfnGetName( hKernel, pSize, pName );

        return result;
    }